

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall
Js::ScriptContext::RedeferFunctionBodies
          (ScriptContext *this,ActiveFunctionSet *pActiveFuncs,uint inactiveThreshold)

{
  RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
  *this_00;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar1;
  Type pcVar2;
  long *plVar3;
  FunctionBody *pFVar4;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar5;
  FunctionEntryPointInfo *this_01;
  code *pcVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  undefined4 *puVar10;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  int i;
  
  iVar9 = (*(this->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
  if ((char)iVar9 != '\0') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x45e,"(!this->IsClosed())","!this->IsClosed()");
    if (!bVar7) {
LAB_006ea9ee:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar10 = 0;
  }
  bVar7 = IsScriptContextInNonDebugMode(this);
  if ((bVar7) &&
     ((this->sourceList).ptr !=
      (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
       *)0x0)) {
    this_00 = &this->sourceList;
    pLVar11 = Memory::
              RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
              ::operator->(this_00);
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    for (lVar14 = 0;
        lVar14 < (pLVar11->
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                 ).count; lVar14 = lVar14 + 1) {
      pRVar1 = (pLVar11->
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
               ).buffer.ptr[lVar14].ptr;
      if (((((ulong)pRVar1 & 1) == 0 && pRVar1 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0)
          && (pcVar2 = (pRVar1->super_RecyclerWeakReferenceBase).strongRef, pcVar2 != (Type)0x0)) &&
         (plVar3 = *(long **)(pcVar2 + 0x18), plVar3 != (long *)0x0)) {
        for (uVar13 = 0; uVar13 < *(uint *)((long)plVar3 + 0x1c); uVar13 = uVar13 + 1) {
          iVar9 = *(int *)(*plVar3 + uVar13 * 4);
          if (iVar9 != -1) {
            while (iVar9 != -1) {
              lVar12 = (long)iVar9;
              iVar9 = *(int *)(plVar3[1] + 8 + lVar12 * 0x10);
              pFVar4 = *(FunctionBody **)(plVar3[1] + lVar12 * 0x10);
              if (pFVar4 == (FunctionBody *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar10 = 1;
                bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                            ,0xa2,"(functionBody)","functionBody");
                if (!bVar7) goto LAB_006ea9ee;
                *puVar10 = 0;
              }
              bVar7 = FunctionBody::InterpretedSinceCallCountCollection(pFVar4);
              FunctionBody::CollectInterpretedCounts(pFVar4);
              pSVar5 = (pFVar4->entryPoints).ptr;
              if (pSVar5 != (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                             *)0x0) {
                for (lVar12 = 0;
                    lVar12 < (pSVar5->
                             super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                             ).
                             super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                             .count; lVar12 = lVar12 + 1) {
                  this_01 = (FunctionEntryPointInfo *)
                            (((pSVar5->
                              super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                              ).
                              super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                              .buffer.ptr[lVar12].ptr)->super_RecyclerWeakReferenceBase).strongRef;
                  if (this_01 != (FunctionEntryPointInfo *)0x0) {
                    bVar8 = EntryPointInfo::IsCleanedUp((EntryPointInfo *)this_01);
                    if (!bVar8) {
                      bVar8 = FunctionEntryPointInfo::ExecutedSinceCallCountCollection(this_01);
                      bVar7 = (bool)(bVar7 | bVar8);
                    }
                    FunctionEntryPointInfo::CollectCallCounts(this_01);
                  }
                }
              }
              if (bVar7 == false) {
                FunctionBody::IncrInactiveCount(pFVar4,inactiveThreshold);
              }
              else {
                pFVar4->inactiveCount = 0;
              }
              if (pActiveFuncs != (ActiveFunctionSet *)0x0) {
                bVar7 = ThreadContext::DoRedeferFunctionBodies(this->threadContext);
                if (!bVar7) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar10 = 1;
                  bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                              ,0x480,
                                              "(this->GetThreadContext()->DoRedeferFunctionBodies())"
                                              ,"this->GetThreadContext()->DoRedeferFunctionBodies()"
                                             );
                  if (!bVar7) goto LAB_006ea9ee;
                  *puVar10 = 0;
                }
                bVar7 = FunctionBody::DoRedeferFunction(pFVar4,inactiveThreshold);
                if (!bVar7) {
                  FunctionBody::UpdateActiveFunctionSet
                            (pFVar4,pActiveFuncs,(FunctionCodeGenRuntimeData *)0x0);
                }
              }
            }
          }
        }
      }
    }
    if ((pActiveFuncs != (ActiveFunctionSet *)0x0) &&
       (this_00->ptr !=
        (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
         *)0x0)) {
      pLVar11 = Memory::
                RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
                ::operator->(this_00);
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      for (lVar14 = 0;
          lVar14 < (pLVar11->
                   super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                   ).count; lVar14 = lVar14 + 1) {
        pRVar1 = (pLVar11->
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                 ).buffer.ptr[lVar14].ptr;
        if (((((ulong)pRVar1 & 1) == 0 && pRVar1 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0
             ) && (pcVar2 = (pRVar1->super_RecyclerWeakReferenceBase).strongRef, pcVar2 != (Type)0x0
                  )) && (plVar3 = *(long **)(pcVar2 + 0x18), plVar3 != (long *)0x0)) {
          for (uVar13 = 0; uVar13 < *(uint *)((long)plVar3 + 0x1c); uVar13 = uVar13 + 1) {
            iVar9 = *(int *)(*plVar3 + uVar13 * 4);
            if (iVar9 != -1) {
              while (iVar9 != -1) {
                lVar12 = (long)iVar9;
                iVar9 = *(int *)(plVar3[1] + 8 + lVar12 * 0x10);
                pFVar4 = *(FunctionBody **)(plVar3[1] + lVar12 * 0x10);
                if (pFVar4 == (FunctionBody *)0x0) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar10 = 1;
                  bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                              ,0xa2,"(functionBody)","functionBody");
                  if (!bVar7) goto LAB_006ea9ee;
                  *puVar10 = 0;
                }
                bVar7 = FunctionBody::IsActiveFunction(pFVar4,pActiveFuncs);
                if (bVar7) {
                  pFVar4->field_0x17d = pFVar4->field_0x17d & 0xfd;
                }
                else {
                  bVar7 = FunctionBody::DoRedeferFunction(pFVar4,inactiveThreshold);
                  if (!bVar7) {
                    AssertCount = AssertCount + 1;
                    Throw::LogAssert();
                    *puVar10 = 1;
                    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                                ,0x494,
                                                "(functionBody->DoRedeferFunction(inactiveThreshold))"
                                                ,
                                                "functionBody->DoRedeferFunction(inactiveThreshold)"
                                               );
                    if (!bVar7) goto LAB_006ea9ee;
                    *puVar10 = 0;
                  }
                  FunctionBody::RedeferFunction(pFVar4);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ScriptContext::RedeferFunctionBodies(ActiveFunctionSet *pActiveFuncs, uint inactiveThreshold)
    {
        Assert(!this->IsClosed());

        if (!this->IsScriptContextInNonDebugMode())
        {
            return;
        }

        // For each active function, collect call counts, update inactive counts, and redefer if appropriate.
        // In the redeferral case, we require 2 passes over the set of FunctionBody's.
        // This is because a function inlined in a non-redeferred function cannot itself be redeferred.
        // So we first need to close over the set of non-redeferrable functions, then go back and redefer
        // the eligible candidates.

        auto fn = [&](FunctionBody *functionBody) {
            bool exec = functionBody->InterpretedSinceCallCountCollection();
            functionBody->CollectInterpretedCounts();
            functionBody->MapEntryPoints([&](int index, FunctionEntryPointInfo *entryPointInfo) {
                if (!entryPointInfo->IsCleanedUp() && entryPointInfo->ExecutedSinceCallCountCollection())
                {
                    exec = true;
                }
                entryPointInfo->CollectCallCounts();
            });
            if (exec)
            {
                functionBody->SetInactiveCount(0);
            }
            else
            {
                functionBody->IncrInactiveCount(inactiveThreshold);
            }

            if (pActiveFuncs)
            {
                Assert(this->GetThreadContext()->DoRedeferFunctionBodies());
                bool doRedefer = functionBody->DoRedeferFunction(inactiveThreshold);
                if (!doRedefer)
                {
                    functionBody->UpdateActiveFunctionSet(pActiveFuncs, nullptr);
                }
            }
        };

        this->MapFunction(fn);

        if (!pActiveFuncs)
        {
            return;
        }

        auto fnRedefer = [&](FunctionBody * functionBody) {
            Assert(pActiveFuncs);
            if (!functionBody->IsActiveFunction(pActiveFuncs))
            {
                Assert(functionBody->DoRedeferFunction(inactiveThreshold));
                functionBody->RedeferFunction();
            }
            else
            {
                functionBody->ResetRedeferralAttributes();
            }
        };

        this->MapFunction(fnRedefer);
    }